

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VScaleVectorArray(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  int iVar2;
  int iVar3;
  N_Vector *X_00;
  N_Vector *Z_00;
  double dVar4;
  double dVar5;
  N_Vector *Z;
  N_Vector *Y;
  realtype c [3];
  double maxt;
  double stop_time;
  double start_time;
  int ierr;
  int failure;
  int fails;
  int myid_local;
  sunindextype local_length_local;
  N_Vector X_local;
  
  ierr = 0;
  X_00 = N_VCloneVectorArray(3,X);
  Z_00 = N_VCloneVectorArray(3,X);
  N_VConst(0.5,*X_00);
  Y = (N_Vector *)0x4000000000000000;
  dVar4 = get_time();
  iVar1 = N_VScaleVectorArray(1,(realtype *)&Y,X_00,X_00);
  sync_device();
  dVar5 = get_time();
  if (iVar1 == 0) {
    start_time._4_4_ = check_ans(1.0,*X_00,param_2);
  }
  else {
    start_time._4_4_ = 1;
  }
  if (start_time._4_4_ == 0) {
    if (myid == 0) {
      printf("PASSED test -- N_VScaleVectorArray Case 1a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n",(ulong)(uint)myid);
    ierr = 1;
  }
  c[2] = max_time(X,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",c[2],"N_VScaleVectorArray");
  }
  N_VConst(0.5,*X_00);
  Y = (N_Vector *)0x4000000000000000;
  dVar4 = get_time();
  iVar1 = N_VScaleVectorArray(1,(realtype *)&Y,X_00,Z_00);
  sync_device();
  dVar5 = get_time();
  if (iVar1 == 0) {
    start_time._4_4_ = check_ans(1.0,*Z_00,param_2);
  }
  else {
    start_time._4_4_ = 1;
  }
  if (start_time._4_4_ == 0) {
    if (myid == 0) {
      printf("PASSED test -- N_VScaleVectorArray Case 1b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n",(ulong)(uint)myid);
    ierr = ierr + 1;
  }
  c[2] = max_time(X,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",c[2],"N_VScaleVectorArray");
  }
  N_VConst(0.5,*X_00);
  N_VConst(-2.0,X_00[1]);
  N_VConst(-1.0,X_00[2]);
  Y = (N_Vector *)0x4000000000000000;
  c[0] = 0.5;
  c[1] = -2.0;
  dVar4 = get_time();
  iVar1 = N_VScaleVectorArray(3,(realtype *)&Y,X_00,X_00);
  sync_device();
  dVar5 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,*X_00,param_2);
    iVar2 = check_ans(-1.0,X_00[1],param_2);
    iVar3 = check_ans(2.0,X_00[2],param_2);
    start_time._4_4_ = iVar3 + iVar2 + iVar1;
  }
  else {
    start_time._4_4_ = 1;
  }
  if (start_time._4_4_ == 0) {
    if (myid == 0) {
      printf("PASSED test -- N_VScaleVectorArray Case 2a \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n",(ulong)(uint)myid);
    ierr = ierr + 1;
  }
  c[2] = max_time(X,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",c[2],"N_VScaleVectorArray");
  }
  N_VConst(0.5,*X_00);
  N_VConst(-2.0,X_00[1]);
  N_VConst(-1.0,X_00[2]);
  Y = (N_Vector *)0x4000000000000000;
  c[0] = 0.5;
  c[1] = -2.0;
  dVar4 = get_time();
  iVar1 = N_VScaleVectorArray(3,(realtype *)&Y,X_00,Z_00);
  sync_device();
  dVar5 = get_time();
  if (iVar1 == 0) {
    iVar1 = check_ans(1.0,*Z_00,param_2);
    iVar2 = check_ans(-1.0,Z_00[1],param_2);
    iVar3 = check_ans(2.0,Z_00[2],param_2);
    start_time._4_4_ = iVar3 + iVar2 + iVar1;
  }
  else {
    start_time._4_4_ = 1;
  }
  if (start_time._4_4_ == 0) {
    if (myid == 0) {
      printf("PASSED test -- N_VScaleVectorArray Case 2b \n");
    }
  }
  else {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n",(ulong)(uint)myid);
    ierr = ierr + 1;
  }
  c[2] = max_time(X,dVar5 - dVar4);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",c[2],"N_VScaleVectorArray");
  }
  N_VDestroyVectorArray(X_00,3);
  N_VDestroyVectorArray(Z_00,3);
  return ierr;
}

Assistant:

int Test_N_VScaleVectorArray(N_Vector X, sunindextype local_length, int myid)
{
  int      fails = 0, failure = 0, ierr = 0;
  double   start_time, stop_time, maxt;

  realtype c[3];
  N_Vector *Y, *Z;

  /* create vectors for testing */
  Y = N_VCloneVectorArray(3, X);
  Z = N_VCloneVectorArray(3, X);

  /*
   * Case 1a: Y[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr = N_VScaleVectorArray(1, c, Y, Y);
  sync_device();
  stop_time = get_time();

  /* Y[0] should be a vector of +1 */
  if (ierr == 0)
    failure = check_ans(ONE, Y[0], local_length);
  else
    failure = 1;

  if (failure) {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1a, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleVectorArray Case 1a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 1b: Z[0] = c[0] Y[0], N_VScale
   */

  /* fill vector data */
  N_VConst(HALF, Y[0]);

  c[0] = TWO;

  start_time = get_time();
  ierr = N_VScaleVectorArray(1, c, Y, Z);
  sync_device();
  stop_time = get_time();

  /* Z[0] should be a vector of +1 */
  if (ierr == 0)
    failure = check_ans(ONE, Z[0], local_length);
  else
    failure = 1;

  if (failure) {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 1b, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleVectorArray Case 1b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2a: Y[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF,    Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr = N_VScaleVectorArray(3, c, Y, Y);
  sync_device();
  stop_time = get_time();

  /* Y[i] should be a vector of +1, -1, 2 */
  if (ierr == 0) {
    failure  = check_ans(ONE,     Y[0], local_length);
    failure += check_ans(NEG_ONE, Y[1], local_length);
    failure += check_ans(TWO,     Y[2], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2a, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleVectorArray Case 2a \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /*
   * Case 2b: Z[i] = c[i] Y[i]
   */

  /* fill vector data */
  N_VConst(HALF,    Y[0]);
  N_VConst(NEG_TWO, Y[1]);
  N_VConst(NEG_ONE, Y[2]);

  c[0] = TWO;
  c[1] = HALF;
  c[2] = NEG_TWO;

  start_time = get_time();
  ierr = N_VScaleVectorArray(3, c, Y, Z);
  sync_device();
  stop_time = get_time();

  /* Z[i] should be a vector of +1, -1, 2 */
  if (ierr == 0) {
    failure  = check_ans(ONE,     Z[0], local_length);
    failure += check_ans(NEG_ONE, Z[1], local_length);
    failure += check_ans(TWO,     Z[2], local_length);
  } else {
    failure = 1;
  }

  if (failure) {
    printf(">>> FAILED test -- N_VScaleVectorArray Case 2b, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VScaleVectorArray Case 2b \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VScaleVectorArray", maxt);

  /* Free vectors */
  N_VDestroyVectorArray(Y, 3);
  N_VDestroyVectorArray(Z, 3);

  return(fails);
}